

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

void __thiscall mat_lib::vector<double>::vector(vector<double> *this,list *vec)

{
  ulong uVar1;
  object_base local_78;
  ulong local_70;
  result_type local_68;
  proxy<boost::python::api::item_policies> local_60;
  extract_rvalue<double> local_50;
  
  uVar1 = boost::python::len((object *)vec);
  this->max_size__ = uVar1;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->container__).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->format__ = fixed;
  this->fractional_digits__ = 6;
  for (local_70 = 0; local_70 < uVar1; local_70 = local_70 + 1) {
    boost::python::api::object_operators<boost::python::api::object>::operator[]<unsigned_long>
              ((object_operators<boost::python::api::object> *)&local_60,(unsigned_long *)vec);
    boost::python::api::proxy::operator_cast_to_object((proxy *)&local_78);
    boost::python::converter::extract_rvalue<double>::extract_rvalue(&local_50,local_78.m_ptr);
    local_68 = boost::python::converter::extract_rvalue<double>::operator()(&local_50);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->container__,&local_68)
    ;
    boost::python::api::object_base::~object_base(&local_78);
    boost::python::api::proxy<boost::python::api::item_policies>::~proxy(&local_60);
    uVar1 = this->max_size__;
  }
  return;
}

Assistant:

vector(boost::python::list vec): max_size__{static_cast<size_t>(boost::python::len(vec))} {
          for(size_t i = 0 ; i < max_size__; i++) container__.push_back(boost::python::extract<element_t>(vec[i]));
      }